

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O2

int mtar_read_header(mtar_t *tar,mtar_header_t *h)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uint chksum2;
  size_t local_230;
  mtar_raw_header_t rh;
  
  tar->last_header = tar->pos;
  iVar2 = (*tar->read)(tar,&rh,0x200);
  tar->pos = tar->pos + 0x200;
  if (iVar2 == 0) {
    sVar1 = tar->last_header;
    iVar2 = (*tar->seek)(tar,sVar1);
    tar->pos = sVar1;
    if (iVar2 == 0) {
      sVar4 = strlen(rh.name);
      iVar2 = -9;
      if (sVar4 < 100) {
        sVar4 = strlen(rh.linkname);
        if (sVar4 < 100) {
          if (rh.checksum[0] == '\0') {
            iVar2 = -7;
          }
          else {
            uVar3 = mtar_checksum(&rh);
            __isoc99_sscanf(rh.checksum,"%7o",&chksum2);
            if (uVar3 == chksum2) {
              iVar2 = 0;
              __isoc99_sscanf(rh.mode,"%7o",h);
              __isoc99_sscanf(rh.owner,"%7o",&h->owner);
              local_230 = 0;
              __isoc99_sscanf(rh.size,"%11llo",&local_230);
              h->size = local_230;
              __isoc99_sscanf(rh.mtime,"%11o",&h->mtime);
              h->type = (int)rh.type;
              if (h->size >> 0x21 == 0) {
                strcpy(h->name,rh.name);
                strcpy(h->linkname,rh.linkname);
              }
              else {
                iVar2 = -10;
              }
            }
            else {
              iVar2 = -6;
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mtar_read_header(mtar_t *tar, mtar_header_t *h) {
  int err;
  mtar_raw_header_t rh;
  /* Save header position */
  tar->last_header = tar->pos;
  /* Read raw header */
  err = mtar_tread(tar, &rh, sizeof(rh));
  if (err) {
    return err;
  }
  /* Seek back to start of header */
  err = mtar_seek(tar, tar->last_header);
  if (err) {
    return err;
  }
  /* Load raw header into header struct and return */
  return mtar_raw_to_header(h, &rh);
}